

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,Pubkey *pubkey,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  AddressFormatData *__return_storage_ptr__;
  NetType_conflict NVar1;
  AddressType local_8c;
  string local_88;
  SchnorrPubkey *local_68;
  Pubkey *local_60;
  ByteData *local_58;
  string *local_50;
  CfdSourceLocation local_48;
  
  this->type_ = type;
  this->addr_type_ = kP2wpkhAddress;
  this->witness_ver_ = witness_ver;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_88);
  local_50 = &this->address_;
  ByteData::ByteData(&this->hash_);
  local_60 = &this->pubkey_;
  local_58 = &this->hash_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  local_68 = &this->schnorr_pubkey_;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  __return_storage_ptr__ = &this->format_data_;
  GetTargetFormatData(__return_storage_ptr__,network_parameters,type);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  NVar1 = AddressFormatData::GetNetType(__return_storage_ptr__);
  this->type_ = NVar1;
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_88,__return_storage_ptr__);
  CalculateP2WPKH(this,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x1d3;
  local_48.funcname = "Address";
  local_8c = kP2wpkhAddress;
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_88,__return_storage_ptr__);
  logger::info<cfd::core::NetType&,cfd::core::AddressType,std::__cxx11::string>
            (&local_48,"call Address({},{},{})",&this->type_,&local_8c,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const Pubkey& pubkey,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(type),
      addr_type_(AddressType::kP2wpkhAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(pubkey),
      schnorr_pubkey_(),
      redeem_script_(),
      format_data_(GetTargetFormatData(network_parameters, type)) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  CalculateP2WPKH(format_data_.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2wpkhAddress, format_data_.GetBech32Hrp());
}